

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaKf.c
# Opt level: O0

void Kf_ManFree(Kf_Man_t *p)

{
  Kf_Man_t *p_local;
  
  if (p->pGia->pRefs != (int *)0x0) {
    free(p->pGia->pRefs);
    p->pGia->pRefs = (int *)0x0;
  }
  if ((p->vCuts).pArray != (int *)0x0) {
    free((p->vCuts).pArray);
    (p->vCuts).pArray = (int *)0x0;
  }
  if ((p->vTime).pArray != (int *)0x0) {
    free((p->vTime).pArray);
    (p->vTime).pArray = (int *)0x0;
  }
  if ((p->vArea).pArray != (float *)0x0) {
    free((p->vArea).pArray);
    (p->vArea).pArray = (float *)0x0;
  }
  if ((p->vRefs).pArray != (float *)0x0) {
    free((p->vRefs).pArray);
    (p->vRefs).pArray = (float *)0x0;
  }
  Vec_IntFreeP(&p->vTemp);
  Vec_SetFree_(&p->pMem);
  if (p != (Kf_Man_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

void Kf_ManFree( Kf_Man_t * p )
{
    ABC_FREE( p->pGia->pRefs );
    ABC_FREE( p->vCuts.pArray );
    ABC_FREE( p->vTime.pArray );
    ABC_FREE( p->vArea.pArray );
    ABC_FREE( p->vRefs.pArray );
    Vec_IntFreeP( &p->vTemp );
    Vec_SetFree_( &p->pMem );
    ABC_FREE( p );
}